

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

Image * Unit_Test::randomRGBImage(Image *__return_storage_ptr__,Image *reference)

{
  uint32_t width_;
  uint32_t height_;
  
  width_ = anon_unknown.dwarf_18be5e::randomSize();
  height_ = anon_unknown.dwarf_18be5e::randomSize();
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,reference,width_,height_,'\x03','\x01');
  anon_unknown.dwarf_18be5e::fillRandomData(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image randomRGBImage(const PenguinV_Image::Image & reference)
    {
        PenguinV_Image::Image image = reference.generate(randomSize(), randomSize(), PenguinV_Image::RGB);

        fillRandomData( image );

        return image;
    }